

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

IsEmptyMatcher * Catch::Matchers::IsEmpty(void)

{
  IsEmptyMatcher *in_RDI;
  
  memset(in_RDI,0,0x28);
  IsEmptyMatcher::IsEmptyMatcher(in_RDI);
  return in_RDI;
}

Assistant:

IsEmptyMatcher IsEmpty() {
        return {};
    }